

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  int iVar1;
  stbi_uc sVar2;
  byte *pbVar3;
  stbi_uc *psVar4;
  uint uVar5;
  stbi__context *psVar6;
  stbi_uc **ppsVar7;
  
  do {
    uVar5 = 0;
    if (j->nomore == 0) {
      psVar6 = j->s;
      pbVar3 = psVar6->img_buffer;
      if (psVar6->img_buffer_end <= pbVar3) {
        if (psVar6->read_from_callbacks == 0) goto LAB_002d54e2;
        stbi__refill_buffer(psVar6);
        pbVar3 = psVar6->img_buffer;
      }
      psVar6->img_buffer = pbVar3 + 1;
      uVar5 = (uint)*pbVar3;
    }
LAB_002d54e2:
    if (uVar5 == 0xff) {
      psVar6 = j->s;
      ppsVar7 = &psVar6->img_buffer;
      psVar4 = psVar6->img_buffer;
      if (psVar4 < psVar6->img_buffer_end) goto LAB_002d550f;
      if (psVar6->read_from_callbacks != 0) goto LAB_002d553f;
      sVar2 = '\0';
LAB_002d5518:
      if (sVar2 == 0xff) {
        psVar6 = j->s;
        psVar4 = psVar6->img_buffer;
        if (psVar6->img_buffer_end <= psVar4) break;
        ppsVar7 = &psVar6->img_buffer;
        goto LAB_002d550f;
      }
      if (sVar2 != '\0') {
        j->marker = sVar2;
        j->nomore = 1;
        return;
      }
    }
    iVar1 = j->code_bits;
    j->code_buffer = j->code_buffer | uVar5 << ((byte)(0x18 - (char)iVar1) & 0x1f);
    j->code_bits = iVar1 + 8;
    if (0x10 < iVar1) {
      return;
    }
  } while( true );
  sVar2 = '\0';
  if (psVar6->read_from_callbacks != 0) {
    ppsVar7 = &psVar6->img_buffer;
LAB_002d553f:
    stbi__refill_buffer(psVar6);
    psVar4 = psVar6->img_buffer;
LAB_002d550f:
    *ppsVar7 = psVar4 + 1;
    sVar2 = *psVar4;
  }
  goto LAB_002d5518;
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      unsigned int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         while (c == 0xff) c = stbi__get8(j->s); // consume fill bytes
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}